

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_cookie_clearsess(CookieInfo *cookies)

{
  Cookie *pCVar1;
  Cookie *pCVar2;
  Cookie *co;
  Cookie *pCVar3;
  Cookie *pCVar4;
  
  if ((cookies != (CookieInfo *)0x0) &&
     (pCVar2 = cookies->cookies, co = pCVar2, pCVar4 = pCVar2, pCVar2 != (Cookie *)0x0)) {
    do {
      pCVar1 = co->next;
      if (co->expires == 0) {
        if (pCVar4 == co) {
          pCVar4 = pCVar1;
        }
        pCVar3 = pCVar1;
        if (pCVar2 != co) {
          pCVar2->next = pCVar1;
          pCVar3 = pCVar2;
        }
        freecookie(co);
        cookies->numcookies = cookies->numcookies + -1;
        co = pCVar3;
      }
      pCVar2 = co;
      co = pCVar1;
    } while (pCVar1 != (Cookie *)0x0);
    cookies->cookies = pCVar4;
  }
  return;
}

Assistant:

void Curl_cookie_clearsess(struct CookieInfo *cookies)
{
  struct Cookie *first, *curr, *next, *prev = NULL;

  if(!cookies || !cookies->cookies)
    return;

  first = curr = prev = cookies->cookies;

  for(; curr; curr = next) {
    next = curr->next;
    if(!curr->expires) {
      if(first == curr)
        first = next;

      if(prev == curr)
        prev = next;
      else
        prev->next = next;

      freecookie(curr);
      cookies->numcookies--;
    }
    else
      prev = curr;
  }

  cookies->cookies = first;
}